

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load-tests.cpp
# Opt level: O2

void __thiscall ComplexClass::ComplexClass(ComplexClass *this)

{
  SimpleStruct *pSVar1;
  SimpleClass *pSVar2;
  ClassWithMemAllocations *this_00;
  LibClass *this_01;
  
  pSVar1 = (SimpleStruct *)operator_new__(0x50);
  this->m_MemberArr1 = pSVar1;
  pSVar2 = (SimpleClass *)operator_new(8);
  pSVar2->m_DoubleMember = 1.1;
  this->m_MemberPtr2 = pSVar2;
  this_00 = (ClassWithMemAllocations *)operator_new(0x18);
  ClassWithMemAllocations::ClassWithMemAllocations(this_00);
  this->m_MemberPtr3 = this_00;
  this_01 = (LibClass *)operator_new(0x50);
  LibClass::LibClass(this_01);
  this->m_MemberPtr4 = this_01;
  return;
}

Assistant:

ComplexClass() {
        m_MemberArr1 = new SimpleStruct[10];
        m_MemberPtr2 = new SimpleClass();
        m_MemberPtr3 = new ClassWithMemAllocations();
        m_MemberPtr4 = new LibClass();
    }